

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_oneof.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::objectivec::OneofGenerator::GenerateCaseEnum
          (OneofGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  objectivec *this_00;
  mapped_type *pmVar1;
  int i;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *field;
  FieldDescriptor *extraout_RDX_00;
  long lVar2;
  string field_name;
  string enum_name;
  string local_50;
  
  variables = &this->variables_;
  io::Printer::Print(printer,variables,"typedef GPB_ENUM($enum_name$) {\n");
  io::Printer::Indent(printer);
  io::Printer::Print(printer,variables,"$enum_name$_GPBUnsetOneOfCase = 0,\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&field_name,"enum_name",(allocator<char> *)&local_50);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&field_name);
  std::__cxx11::string::string((string *)&enum_name,(string *)pmVar1);
  std::__cxx11::string::~string((string *)&field_name);
  field = extraout_RDX;
  for (lVar2 = 0; lVar2 < *(int *)(this->descriptor_ + 0x1c); lVar2 = lVar2 + 1) {
    this_00 = *(objectivec **)(*(long *)(this->descriptor_ + 0x20) + lVar2 * 8);
    FieldNameCapitalized_abi_cxx11_(&field_name,this_00,field);
    SimpleItoa_abi_cxx11_(&local_50,(protobuf *)(ulong)*(uint *)(this_00 + 0x38),i);
    io::Printer::Print(printer,"$enum_name$_$field_name$ = $field_number$,\n","enum_name",&enum_name
                       ,"field_name",&field_name,"field_number",&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&field_name);
    field = extraout_RDX_00;
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"};\n\n");
  std::__cxx11::string::~string((string *)&enum_name);
  return;
}

Assistant:

void OneofGenerator::GenerateCaseEnum(io::Printer* printer) {
  printer->Print(
      variables_,
      "typedef GPB_ENUM($enum_name$) {\n");
  printer->Indent();
  printer->Print(
      variables_,
      "$enum_name$_GPBUnsetOneOfCase = 0,\n");
  string enum_name = variables_["enum_name"];
  for (int j = 0; j < descriptor_->field_count(); j++) {
    const FieldDescriptor* field = descriptor_->field(j);
    string field_name = FieldNameCapitalized(field);
    printer->Print(
        "$enum_name$_$field_name$ = $field_number$,\n",
        "enum_name", enum_name,
        "field_name", field_name,
        "field_number", SimpleItoa(field->number()));
  }
  printer->Outdent();
  printer->Print(
      "};\n"
      "\n");
}